

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_conversation.cpp
# Opt level: O2

void __thiscall FStrifeDialogueNode::~FStrifeDialogueNode(FStrifeDialogueNode *this)

{
  FStrifeDialogueReply *pFVar1;
  FStrifeDialogueReply *this_00;
  
  if (this->SpeakerName != (char *)0x0) {
    operator_delete__(this->SpeakerName);
  }
  if (this->Dialogue != (char *)0x0) {
    operator_delete__(this->Dialogue);
  }
  if (this->Goodbye != (char *)0x0) {
    operator_delete__(this->Goodbye);
  }
  this_00 = this->Children;
  while (this_00 != (FStrifeDialogueReply *)0x0) {
    pFVar1 = this_00->Next;
    FStrifeDialogueReply::~FStrifeDialogueReply(this_00);
    operator_delete(this_00,0x88);
    this_00 = pFVar1;
  }
  TArray<FStrifeDialogueItemCheck,_FStrifeDialogueItemCheck>::~TArray(&this->ItemCheck);
  return;
}

Assistant:

FStrifeDialogueNode::~FStrifeDialogueNode ()
{
	if (SpeakerName != NULL) delete[] SpeakerName;
	if (Dialogue != NULL) delete[] Dialogue;
	if (Goodbye != nullptr) delete[] Goodbye;
	FStrifeDialogueReply *tokill = Children;
	while (tokill != NULL)
	{
		FStrifeDialogueReply *next = tokill->Next;
		delete tokill;
		tokill = next;
	}
}